

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tick.cpp
# Opt level: O2

void __thiscall MetaSim::Tick::Tick(Tick *this,string *s)

{
  bool bVar1;
  ParseExc *this_00;
  allocator local_61;
  double num;
  string unit;
  string local_38;
  
  unit._M_dataplus._M_p = (pointer)&unit.field_2;
  unit._M_string_length = 0;
  unit.field_2._M_local_buf[0] = '\0';
  parse_util::parse_double(s,&num,&unit);
  bVar1 = std::operator!=(&unit,"s");
  if ((((bVar1) && (bVar1 = std::operator!=(&unit,"ms"), bVar1)) &&
      (bVar1 = std::operator!=(&unit,"us"), bVar1)) &&
     ((bVar1 = std::operator!=(&unit,"ns"), bVar1 && (bVar1 = std::operator!=(&unit,""), bVar1)))) {
    this_00 = (ParseExc *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_38,"Cannot understand time unit: ",&local_61);
    parse_util::ParseExc::ParseExc(this_00,&local_38,&unit);
    __cxa_throw(this_00,&parse_util::ParseExc::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(&unit,"");
  if (bVar1) {
    num = (double)default_unit * num;
  }
  else {
    bVar1 = std::operator==(&unit,"s");
    if (bVar1) {
      num = num * 1000000000.0;
    }
    else {
      bVar1 = std::operator==(&unit,"ms");
      if (bVar1) {
        num = num * 1000000.0;
      }
      else {
        bVar1 = std::operator==(&unit,"us");
        if (bVar1) {
          num = num * 1000.0;
        }
        else {
          bVar1 = std::operator==(&unit,"ns");
          if (!bVar1) goto LAB_0011d3dd;
        }
      }
    }
  }
  this->v = (long)(num / (double)resolution);
LAB_0011d3dd:
  std::__cxx11::string::~string((string *)&unit);
  return;
}

Assistant:

Tick::Tick(const string &s)
    {
        string unit;
        double num;

        parse_double(s, num, unit);

        if (unit != "s" && unit != "ms" && unit != "us" && unit != "ns" && unit != "") 
            throw ParseExc("Cannot understand time unit: ", unit);

        if (unit == "") { v = (impl_t)((num * default_unit) / resolution); }
        else if (unit == "s") { v = (impl_t)((num * 1000000000) / resolution);}
        else if (unit == "ms")  { v = (impl_t)((num * 1000000) / resolution); }
        else if (unit == "us")  { v = (impl_t)((num * 1000) / resolution); }
        else if (unit == "ns")  { v = (impl_t)((num) / resolution); }
    }